

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O1

void __thiscall
HighsMipSolverData::callbackUserSolution
          (HighsMipSolverData *this,double mipsolver_objective_value,
          HighsInt user_solution_callback_origin)

{
  HighsCallback *pHVar1;
  HighsMipSolver *this_00;
  HighsLp *lp;
  double *pdVar2;
  pointer pdVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  vector<double,_std::allocator<double>_> local_c8;
  vector<double,_std::allocator<double>_> local_a8;
  double local_90;
  double integrality_violation_;
  double row_violation_;
  double bound_violation_;
  vector<double,_std::allocator<double>_> user_solution;
  HighsCDouble local_58;
  string local_48;
  
  setCallbackDataOut(this,mipsolver_objective_value);
  pHVar1 = this->mipsolver->callback_;
  (pHVar1->data_out).user_solution_callback_origin = user_solution_callback_origin;
  HighsCallback::clearHighsCallbackDataIn(pHVar1);
  pHVar1 = this->mipsolver->callback_;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"MIP User solution","");
  HighsCallback::callbackAction(pHVar1,9,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if ((this->mipsolver->callback_->data_in).user_solution != (double *)0x0) {
    std::vector<double,_std::allocator<double>_>::vector
              (&user_solution,(long)this->mipsolver->orig_model_->num_col_,
               (allocator_type *)&local_c8);
    this_00 = this->mipsolver;
    lp = this_00->orig_model_;
    lVar5 = (long)lp->num_col_;
    if (0 < lVar5) {
      pdVar2 = (this_00->callback_->data_in).user_solution;
      lVar6 = 0;
      do {
        user_solution.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar6] = pdVar2[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar5 != lVar6);
    }
    bound_violation_ = 0.0;
    row_violation_ = 0.0;
    integrality_violation_ = 0.0;
    local_58.hi = 0.0;
    local_58.lo = 0.0;
    bVar4 = HighsMipSolver::solutionFeasible
                      (this_00,lp,&user_solution,(vector<double,_std::allocator<double>_> *)0x0,
                       &bound_violation_,&row_violation_,&integrality_violation_,&local_58);
    if (bVar4) {
      local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_90 = local_58.hi + local_58.lo;
      presolve::HighsPostsolveStack::getReducedPrimalSolution
                (&local_a8,&this->postSolveStack,&user_solution);
      pdVar3 = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if (pdVar3 != (pointer)0x0) {
        operator_delete(pdVar3);
      }
      if (local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      addIncumbent(this,&local_c8,local_90,0xe,true,true);
      if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    else {
      highsLogUser(&(this->mipsolver->options_mip_->super_HighsOptionsStruct).log_options,kWarning,
                   "User-supplied solution has with objective %g has violations: bound = %.4g; integrality = %.4g; row = %.4g\n"
                   ,SUB84(local_58.hi + local_58.lo,0),SUB84(bound_violation_,0),
                   integrality_violation_,row_violation_);
    }
    if (user_solution.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(user_solution.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void HighsMipSolverData::callbackUserSolution(
    const double mipsolver_objective_value,
    const HighsInt user_solution_callback_origin) {
  setCallbackDataOut(mipsolver_objective_value);
  mipsolver.callback_->data_out.user_solution_callback_origin =
      user_solution_callback_origin;

  mipsolver.callback_->clearHighsCallbackDataIn();
  const bool interrupt = mipsolver.callback_->callbackAction(
      kCallbackMipUserSolution, "MIP User solution");
  assert(!interrupt);
  if (mipsolver.callback_->data_in.user_solution) {
    std::vector<double> user_solution(mipsolver.orig_model_->num_col_);
    for (HighsInt iCol = 0; iCol < mipsolver.orig_model_->num_col_; iCol++)
      user_solution[iCol] = mipsolver.callback_->data_in.user_solution[iCol];
    double bound_violation_ = 0;
    double row_violation_ = 0;
    double integrality_violation_ = 0;
    HighsCDouble user_solution_quad_objective_value = 0;
    const bool feasible = mipsolver.solutionFeasible(
        mipsolver.orig_model_, user_solution, nullptr, bound_violation_,
        row_violation_, integrality_violation_,
        user_solution_quad_objective_value);
    double user_solution_objective_value =
        double(user_solution_quad_objective_value);
    if (!feasible) {
      highsLogUser(
          mipsolver.options_mip_->log_options, HighsLogType::kWarning,
          "User-supplied solution has with objective %g has violations: "
          "bound = %.4g; integrality = %.4g; row = %.4g\n",
          user_solution_objective_value, bound_violation_,
          integrality_violation_, row_violation_);
      return;
    }
    std::vector<double> reduced_user_solution;
    reduced_user_solution =
        postSolveStack.getReducedPrimalSolution(user_solution);
    const bool print_display_line = true;
    const bool is_user_solution = true;
    addIncumbent(reduced_user_solution, user_solution_objective_value,
                 kSolutionSourceUserSolution, print_display_line,
                 is_user_solution);
  }
}